

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

void __thiscall Fl_Browser_::sort(Fl_Browser_ *this,int flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  char *tb;
  char *ta;
  char swapped;
  void *c;
  void *b;
  void *a;
  int local_20;
  int desc;
  int n;
  int j;
  int i;
  int flags_local;
  Fl_Browser_ *this_local;
  void *pvVar5;
  
  local_20 = -1;
  iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
  b = (void *)CONCAT44(extraout_var,iVar2);
  if (b != (void *)0x0) {
    while (b != (void *)0x0) {
      iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,b);
      local_20 = local_20 + 1;
      b = (void *)CONCAT44(extraout_var_00,iVar2);
    }
    for (n = local_20; 0 < n; n = n + -1) {
      bVar1 = false;
      iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
      b = (void *)CONCAT44(extraout_var_01,iVar2);
      iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,b);
      c = (void *)CONCAT44(extraout_var_02,iVar2);
      for (desc = 0; desc < n; desc = desc + 1) {
        iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x12])(this,b);
        iVar3 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x12])(this,c);
        iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,c);
        pvVar5 = (void *)CONCAT44(extraout_var_05,iVar4);
        if ((flags & 1U) == 1) {
          iVar2 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),
                         (char *)CONCAT44(extraout_var_04,iVar3));
          if (iVar2 < 0) {
            (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x13])(this,b,c);
            bVar1 = true;
          }
        }
        else {
          iVar2 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),
                         (char *)CONCAT44(extraout_var_04,iVar3));
          if (0 < iVar2) {
            (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x13])(this,b,c);
            bVar1 = true;
          }
        }
        if (pvVar5 == (void *)0x0) break;
        iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvVar5);
        b = (void *)CONCAT44(extraout_var_06,iVar2);
        c = pvVar5;
      }
      if (!bVar1) {
        return;
      }
    }
  }
  return;
}

Assistant:

void Fl_Browser_::sort(int flags) {
  //
  // Simple bubble sort - pure lazyness on my side.
  //
  int i, j, n = -1, desc = ((flags&FL_SORT_DESCENDING)==FL_SORT_DESCENDING);
  void *a =item_first(), *b, *c;
  if (!a) return;
  while (a) {
    a = item_next(a);
    n++;
  }
  for (i=n; i>0; i--) {
    char swapped = 0;
    a = item_first();
    b = item_next(a);
    for (j=0; j<i; j++) {
      const char *ta = item_text(a);
      const char *tb = item_text(b);
      c = item_next(b);
      if (desc) {
        if (strcmp(ta, tb)<0) {
          item_swap(a, b);
          swapped = 1;
        }
      } else {
        if (strcmp(ta, tb)>0) {
          item_swap(a, b);
          swapped = 1;
        }
      }
      if (!c) break;
      b = c; a = item_prev(b);
    }
    if (!swapped)
      break;
  }
}